

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-all.c
# Opt level: O2

void do_tb_phys_invalidate
               (TCGContext_conflict9 *tcg_ctx,TranslationBlock_conflict *tb,_Bool rm_from_page_list)

{
  CPUState_conflict *pCVar1;
  _Bool _Var2;
  uint32_t hash;
  uint uVar3;
  PageDesc *pPVar4;
  uintptr_t *puVar5;
  TranslationBlock_conflict *tb_00;
  
  pCVar1 = tcg_ctx->uc->cpu;
  uVar3 = tb->cflags;
  tb->cflags = uVar3 | 0x40000;
  if ((uVar3 >> 0x10 & 1) == 0) {
    hash = tb_hash_func((ulong)(tb->pc & 0x3fff) + tb->page_addr[0],tb->pc,tb->flags,
                        uVar3 & 0xff0affff,tb->trace_vcpu_dstate);
    _Var2 = qht_remove(&(tcg_ctx->tb_ctx).htable,tb,hash);
    if (!_Var2) {
      return;
    }
  }
  if (rm_from_page_list) {
    pPVar4 = page_find((uc_struct_conflict15 *)tcg_ctx->uc,tb->page_addr[0] >> 0xe);
    tb_page_remove(pPVar4,tb);
    invalidate_page_bitmap(pPVar4);
    if (tb->page_addr[1] != 0xffffffffffffffff) {
      pPVar4 = page_find((uc_struct_conflict15 *)tcg_ctx->uc,tb->page_addr[1] >> 0xe);
      tb_page_remove(pPVar4,tb);
      invalidate_page_bitmap(pPVar4);
    }
  }
  uVar3 = tb->pc >> 8 ^ tb->pc;
  uVar3 = uVar3 & 0x3f | uVar3 >> 8 & 0xfc0;
  if (pCVar1->tb_jmp_cache[uVar3] == tb) {
    pCVar1->tb_jmp_cache[uVar3] = (TranslationBlock_conflict *)0x0;
  }
  tb_remove_from_jmp_list(tb,0);
  tb_remove_from_jmp_list(tb,1);
  puVar5 = &tb->jmp_list_head;
  while( true ) {
    tb_00 = (TranslationBlock_conflict *)(*puVar5 & 0xfffffffffffffffe);
    if (tb_00 == (TranslationBlock_conflict *)0x0) break;
    uVar3 = (uint)*puVar5 & 1;
    tb_reset_jump(tb_00,uVar3);
    puVar5 = tb_00->jmp_list_next + uVar3;
    LOCK();
    tb_00->jmp_dest[uVar3] = tb_00->jmp_dest[uVar3] & 1;
    UNLOCK();
  }
  tb->jmp_list_head = 0;
  tcg_ctx->tb_phys_invalidate_count = tcg_ctx->tb_phys_invalidate_count + 1;
  return;
}

Assistant:

static void do_tb_phys_invalidate(TCGContext *tcg_ctx, TranslationBlock *tb, bool rm_from_page_list)
{
    CPUState *cpu = tcg_ctx->uc->cpu;
    struct uc_struct *uc = tcg_ctx->uc;
    PageDesc *p;
    uint32_t h;
    tb_page_addr_t phys_pc;
    bool code_gen_locked;

    assert_memory_lock();
    code_gen_locked = tb_exec_is_locked(tcg_ctx);
    tb_exec_unlock(tcg_ctx);

    /* make sure no further incoming jumps will be chained to this TB */
    tb->cflags = tb->cflags | CF_INVALID;

    /* remove the TB from the hash list */
    phys_pc = tb->page_addr[0] + (tb->pc & ~TARGET_PAGE_MASK);
    h = tb_hash_func(phys_pc, tb->pc, tb->flags, tb_cflags(tb) & CF_HASH_MASK,
                     tb->trace_vcpu_dstate);
    if (!(tb->cflags & CF_NOCACHE) &&
        !qht_remove(&tcg_ctx->tb_ctx.htable, tb, h)) {
        tb_exec_change(tcg_ctx, code_gen_locked);
        return;
    }

    /* remove the TB from the page list */
    if (rm_from_page_list) {
        p = page_find(tcg_ctx->uc, tb->page_addr[0] >> TARGET_PAGE_BITS);
        tb_page_remove(p, tb);
        invalidate_page_bitmap(p);
        if (tb->page_addr[1] != -1) {
            p = page_find(tcg_ctx->uc, tb->page_addr[1] >> TARGET_PAGE_BITS);
            tb_page_remove(p, tb);
            invalidate_page_bitmap(p);
        }
    }

    /* remove the TB from the hash list */
    h = tb_jmp_cache_hash_func(uc, tb->pc);
    if (cpu->tb_jmp_cache[h] == tb) {
        cpu->tb_jmp_cache[h] = NULL;
    }

    /* suppress this TB from the two jump lists */
    tb_remove_from_jmp_list(tb, 0);
    tb_remove_from_jmp_list(tb, 1);

    /* suppress any remaining jumps to this TB */
    tb_jmp_unlink(tb);

    tcg_ctx->tb_phys_invalidate_count = tcg_ctx->tb_phys_invalidate_count + 1;

    tb_exec_change(tcg_ctx, code_gen_locked);
}